

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O3

void __thiscall soul::AST::Scope::NameSearch::addResult(NameSearch *this,ASTObject *o)

{
  size_t sVar1;
  pool_ref<soul::AST::ASTObject> *ppVar2;
  
  ppVar2 = (this->itemsFound).items;
  ppVar2 = std::
           __find_if<soul::pool_ref<soul::AST::ASTObject>const*,__gnu_cxx::__ops::_Iter_equals_val<soul::AST::ASTObject_const>>
                     (ppVar2,ppVar2 + (this->itemsFound).numActive,o);
  sVar1 = (this->itemsFound).numActive;
  if (ppVar2 == (this->itemsFound).items + sVar1) {
    ArrayWithPreallocation<soul::pool_ref<soul::AST::ASTObject>,_8UL>::reserve
              (&this->itemsFound,sVar1 + 1);
    sVar1 = (this->itemsFound).numActive;
    (this->itemsFound).items[sVar1].object = o;
    (this->itemsFound).numActive = sVar1 + 1;
  }
  return;
}

Assistant:

void addResult (ASTObject& o)
            {
                if (! contains (itemsFound, o))
                    itemsFound.push_back (o);
            }